

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O0

void __thiscall fasttext::QMatrix::quantize(QMatrix *this,Matrix *matrix)

{
  Matrix *pMVar1;
  QMatrix *pQVar2;
  Vector *norms_00;
  ProductQuantizer *x;
  pointer codes;
  Vector *in_RDI;
  real *dataptr;
  Vector norms;
  Matrix temp;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  Matrix *in_stack_ffffffffffffff60;
  Matrix *in_stack_ffffffffffffff68;
  Matrix *in_stack_ffffffffffffff70;
  ProductQuantizer *this_00;
  QMatrix *this_01;
  Matrix *this_02;
  
  this_02 = (Matrix *)
            in_RDI[3].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar1 = (Matrix *)Matrix::size(in_stack_ffffffffffffff68,(int64_t)in_stack_ffffffffffffff60);
  if (this_02 != pMVar1) {
    __assert_fail("m_ == matrix.size(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                  ,0x29,"void fasttext::QMatrix::quantize(const Matrix &)");
  }
  this_01 = (QMatrix *)
            in_RDI[3].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pQVar2 = (QMatrix *)Matrix::size(in_stack_ffffffffffffff68,(int64_t)in_stack_ffffffffffffff60);
  if (this_01 == pQVar2) {
    Matrix::Matrix(in_stack_ffffffffffffff60,
                   (Matrix *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (((ulong)in_RDI[2].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 1) != 0) {
      norms_00 = (Vector *)
                 Matrix::size(in_stack_ffffffffffffff68,(int64_t)in_stack_ffffffffffffff60);
      Vector::Vector((Vector *)this_02,(int64_t)in_RDI);
      Matrix::l2NormRow(in_stack_ffffffffffffff70,(Vector *)in_stack_ffffffffffffff68);
      Matrix::divideRow(this_02,in_RDI,(int64_t)this_01,(int64_t)norms_00);
      quantizeNorm(this_01,norms_00);
      Vector::~Vector((Vector *)0x182419);
    }
    x = (ProductQuantizer *)Matrix::data((Matrix *)0x182455);
    this_00 = x;
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                *)0x182470);
    ProductQuantizer::train((ProductQuantizer *)this,matrix._4_4_,(real *)temp.n_);
    codes = std::
            unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
            ::operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                          *)0x182491);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1824ae);
    ProductQuantizer::compute_codes(this_00,(real *)x,(uint8_t *)codes,in_stack_ffffffffffffff5c);
    Matrix::~Matrix((Matrix *)0x1824d4);
    return;
  }
  __assert_fail("n_ == matrix.size(1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                ,0x2a,"void fasttext::QMatrix::quantize(const Matrix &)");
}

Assistant:

void QMatrix::quantize(const Matrix& matrix) {
  assert(m_ == matrix.size(0));
  assert(n_ == matrix.size(1));
  Matrix temp(matrix);
  if (qnorm_) {
    Vector norms(temp.size(0));
    temp.l2NormRow(norms);
    temp.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = temp.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}